

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_state_type(Curl_easy *data)

{
  connectdata *conn;
  CURLcode CVar1;
  
  conn = data->conn;
  if (((((data->set).field_0x8e5 & 2) != 0) && ((conn->proto).ftpc.file != (char *)0x0)) &&
     ((uint)(((data->state).field_0x6d1 & 0x80) == 0) * 8 + 0x41 !=
      (int)(conn->proto).ftpc.transfertype)) {
    ((data->req).p.file)->fd = 1;
    CVar1 = ftp_nb_type(data,conn,SUB21((ushort)*(undefined2 *)&(data->state).field_0x6d0 >> 0xf,0),
                        FTP_TYPE);
    return CVar1;
  }
  if ((((data->req).p.file)->fd == 1) && ((conn->proto).ftpc.file != (char *)0x0)) {
    CVar1 = Curl_pp_sendf(data,&(conn->proto).ftpc.pp,"SIZE %s");
    if (CVar1 == CURLE_OK) {
      (data->conn->proto).ftpc.state = FTP_SIZE;
      CVar1 = CURLE_OK;
    }
    return CVar1;
  }
  CVar1 = ftp_state_rest(data,conn);
  return CVar1;
}

Assistant:

static CURLcode ftp_state_type(struct Curl_easy *data)
{
  CURLcode result = CURLE_OK;
  struct FTP *ftp = data->req.p.ftp;
  struct connectdata *conn = data->conn;
  struct ftp_conn *ftpc = &conn->proto.ftpc;

  /* If we have selected NOBODY and HEADER, it means that we only want file
     information. Which in FTP can't be much more than the file size and
     date. */
  if(data->set.opt_no_body && ftpc->file &&
     ftp_need_type(conn, data->state.prefer_ascii)) {
    /* The SIZE command is _not_ RFC 959 specified, and therefore many servers
       may not support it! It is however the only way we have to get a file's
       size! */

    ftp->transfer = PPTRANSFER_INFO;
    /* this means no actual transfer will be made */

    /* Some servers return different sizes for different modes, and thus we
       must set the proper type before we check the size */
    result = ftp_nb_type(data, conn, data->state.prefer_ascii, FTP_TYPE);
    if(result)
      return result;
  }
  else
    result = ftp_state_size(data, conn);

  return result;
}